

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaseInsensitive.cpp
# Opt level: O2

bool UnifiedRegex::CaseInsensitive::RangeToEquivClass
               (uint *tblidx,uint l,uint h,uint *acth,codepoint_t *equivl)

{
  uint uVar1;
  code *pcVar2;
  uint c;
  bool bVar3;
  Char CVar4;
  undefined4 *puVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  int i;
  long lVar9;
  
  if (h < l) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CaseInsensitive.cpp"
                       ,0x1ce,"(l <= h)","l <= h");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if (l < 0x118e0) {
    uVar8 = (ulong)*tblidx;
    pcVar6 = transforms + uVar8 * 0x1c;
    while (uVar8 < 0x16d) {
      if ((l <= *(uint *)(pcVar6 + 8)) && ((byte)pcVar6[1] < 2)) {
        uVar1 = *(uint *)(pcVar6 + 4);
        c = l;
        if (l < uVar1) {
          c = uVar1;
        }
        uVar7 = *(uint *)(pcVar6 + 8);
        if (*pcVar6 != '\x01') {
          uVar7 = c;
        }
        if (h <= uVar7) {
          uVar7 = h;
        }
        if (c <= uVar7) {
          if (l < uVar1) {
            *acth = c - 1;
            for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
              CVar4 = Chars<unsigned_int>::UTC(l);
              equivl[lVar9] = CVar4;
            }
            return false;
          }
          *acth = uVar7;
          Transform::Apply<unsigned_int>((Transform *)(transforms + (ulong)*tblidx * 0x1c),c,equivl)
          ;
          return true;
        }
        break;
      }
      uVar8 = uVar8 + 1;
      *tblidx = (uint)uVar8;
      pcVar6 = pcVar6 + 0x1c;
    }
  }
  *acth = h;
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    CVar4 = Chars<unsigned_int>::UTC(l);
    equivl[lVar9] = CVar4;
  }
  return false;
}

Assistant:

bool RangeToEquivClass(uint & tblidx, uint l, uint h, uint & acth, __out_ecount(EquivClassSize) codepoint_t equivl[EquivClassSize])
        {
            return RangeToEquivClass(tblidx, l, h, acth, equivl, [](MappingSource source) {
                return source == MappingSource::CaseFolding || source == MappingSource::UnicodeData;
            });
        }